

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

int parse_netscape(Cookie *co,CookieInfo *ci,char *lineptr,_Bool secure)

{
  int iVar1;
  CURLofft CVar2;
  Curl_llist_dtor p_Var3;
  char *pcVar4;
  Curl_llist_node *pCVar5;
  int local_4c;
  char *pcStack_48;
  int fields;
  char *tok_buf;
  char *firstptr;
  char *ptr;
  char *pcStack_28;
  _Bool secure_local;
  char *lineptr_local;
  CookieInfo *ci_local;
  Cookie *co_local;
  
  pcStack_48 = (char *)0x0;
  ptr._7_1_ = secure;
  pcStack_28 = lineptr;
  lineptr_local = (char *)ci;
  ci_local = (CookieInfo *)co;
  iVar1 = strncmp(lineptr,"#HttpOnly_",10);
  if (iVar1 == 0) {
    pcStack_28 = pcStack_28 + 10;
    *(byte *)((long)&ci_local->cookielist[3]._dtor + 4) =
         *(byte *)((long)&ci_local->cookielist[3]._dtor + 4) & 0xf7 | 8;
  }
  if (*pcStack_28 == '#') {
    co_local._4_4_ = 0xb;
  }
  else {
    firstptr = strchr(pcStack_28,0xd);
    if (firstptr != (char *)0x0) {
      *firstptr = '\0';
    }
    firstptr = strchr(pcStack_28,10);
    if (firstptr != (char *)0x0) {
      *firstptr = '\0';
    }
    tok_buf = strtok_r(pcStack_28,"\t",&stack0xffffffffffffffb8);
    local_4c = 0;
    firstptr = tok_buf;
    while (firstptr != (char *)0x0) {
      switch(local_4c) {
      case 0:
        if (*firstptr == '.') {
          firstptr = firstptr + 1;
        }
        pCVar5 = (Curl_llist_node *)(*Curl_cstrdup)(firstptr);
        ci_local->cookielist[3]._head = pCVar5;
        if (ci_local->cookielist[3]._head == (Curl_llist_node *)0x0) {
          return 9;
        }
        break;
      case 1:
        iVar1 = curl_strequal(firstptr,"TRUE");
        *(byte *)((long)&ci_local->cookielist[3]._dtor + 4) =
             *(byte *)((long)&ci_local->cookielist[3]._dtor + 4) & 0xfe | iVar1 != 0;
        break;
      case 2:
        iVar1 = strcmp("TRUE",firstptr);
        if ((iVar1 == 0) || (iVar1 = strcmp("FALSE",firstptr), iVar1 == 0)) {
          p_Var3 = (Curl_llist_dtor)(*Curl_cstrdup)("/");
          ci_local->cookielist[2]._dtor = p_Var3;
          if (ci_local->cookielist[2]._dtor == (Curl_llist_dtor)0x0) {
            return 9;
          }
          pcVar4 = (*Curl_cstrdup)("/");
          ci_local->cookielist[2]._size = (size_t)pcVar4;
          if (ci_local->cookielist[2]._size == 0) {
            return 9;
          }
          local_4c = local_4c + 1;
          goto switchD_001285e6_caseD_3;
        }
        p_Var3 = (Curl_llist_dtor)(*Curl_cstrdup)(firstptr);
        ci_local->cookielist[2]._dtor = p_Var3;
        if (ci_local->cookielist[2]._dtor == (Curl_llist_dtor)0x0) {
          return 9;
        }
        pcVar4 = sanitize_cookie_path((char *)ci_local->cookielist[2]._dtor);
        ci_local->cookielist[2]._size = (size_t)pcVar4;
        if (ci_local->cookielist[2]._size == 0) {
          return 9;
        }
        break;
      case 3:
switchD_001285e6_caseD_3:
        *(byte *)((long)&ci_local->cookielist[3]._dtor + 4) =
             *(byte *)((long)&ci_local->cookielist[3]._dtor + 4) & 0xfd;
        iVar1 = curl_strequal(firstptr,"TRUE");
        if (iVar1 != 0) {
          if (((ptr._7_1_ & 1) == 0) && ((lineptr_local[0x7f0] & 1U) == 0)) {
            return 8;
          }
          *(byte *)((long)&ci_local->cookielist[3]._dtor + 4) =
               *(byte *)((long)&ci_local->cookielist[3]._dtor + 4) & 0xfd | 2;
        }
        break;
      case 4:
        CVar2 = curlx_strtoofft(firstptr,(char **)0x0,10,
                                (curl_off_t *)&ci_local->cookielist[3]._tail);
        if (CVar2 != CURL_OFFT_OK) {
          return 0xc;
        }
        break;
      case 5:
        pCVar5 = (Curl_llist_node *)(*Curl_cstrdup)(firstptr);
        ci_local->cookielist[2]._head = pCVar5;
        if (ci_local->cookielist[2]._head == (Curl_llist_node *)0x0) {
          return 9;
        }
        iVar1 = curl_strnequal("__Secure-",(char *)ci_local->cookielist[2]._head,9);
        if (iVar1 == 0) {
          iVar1 = curl_strnequal("__Host-",(char *)ci_local->cookielist[2]._head,7);
          if (iVar1 != 0) {
            *(byte *)((long)&ci_local->cookielist[3]._dtor + 4) =
                 *(byte *)((long)&ci_local->cookielist[3]._dtor + 4) & 0xdf | 0x20;
          }
        }
        else {
          *(byte *)((long)&ci_local->cookielist[3]._dtor + 4) =
               *(byte *)((long)&ci_local->cookielist[3]._dtor + 4) & 0xef | 0x10;
        }
        break;
      case 6:
        pCVar5 = (Curl_llist_node *)(*Curl_cstrdup)(firstptr);
        ci_local->cookielist[2]._tail = pCVar5;
        if (ci_local->cookielist[2]._tail == (Curl_llist_node *)0x0) {
          return 9;
        }
      }
      firstptr = strtok_r((char *)0x0,"\t",&stack0xffffffffffffffb8);
      local_4c = local_4c + 1;
    }
    if (local_4c == 6) {
      pCVar5 = (Curl_llist_node *)(*Curl_cstrdup)("");
      ci_local->cookielist[2]._tail = pCVar5;
      if (ci_local->cookielist[2]._tail == (Curl_llist_node *)0x0) {
        return 9;
      }
      local_4c = 7;
    }
    if (local_4c == 7) {
      co_local._4_4_ = 0;
    }
    else {
      co_local._4_4_ = 0xd;
    }
  }
  return co_local._4_4_;
}

Assistant:

static int
parse_netscape(struct Cookie *co,
               struct CookieInfo *ci,
               const char *lineptr,
               bool secure)  /* TRUE if connection is over secure
                                origin */
{
  /*
   * This line is NOT an HTTP header style line, we do offer support for
   * reading the odd netscape cookies-file format here
   */
  char *ptr;
  char *firstptr;
  char *tok_buf = NULL;
  int fields;

  /*
   * In 2008, Internet Explorer introduced HTTP-only cookies to prevent XSS
   * attacks. Cookies marked httpOnly are not accessible to JavaScript. In
   * Firefox's cookie files, they are prefixed #HttpOnly_ and the rest
   * remains as usual, so we skip 10 characters of the line.
   */
  if(strncmp(lineptr, "#HttpOnly_", 10) == 0) {
    lineptr += 10;
    co->httponly = TRUE;
  }

  if(lineptr[0]=='#')
    /* do not even try the comments */
    return CERR_COMMENT;

  /* strip off the possible end-of-line characters */
  ptr = strchr(lineptr, '\r');
  if(ptr)
    *ptr = 0; /* clear it */
  ptr = strchr(lineptr, '\n');
  if(ptr)
    *ptr = 0; /* clear it */

  firstptr = strtok_r((char *)lineptr, "\t", &tok_buf); /* tokenize on TAB */

  /*
   * Now loop through the fields and init the struct we already have
   * allocated
   */
  fields = 0;
  for(ptr = firstptr; ptr; ptr = strtok_r(NULL, "\t", &tok_buf), fields++) {
    switch(fields) {
    case 0:
      if(ptr[0]=='.') /* skip preceding dots */
        ptr++;
      co->domain = strdup(ptr);
      if(!co->domain)
        return CERR_OUT_OF_MEMORY;
      break;
    case 1:
      /*
       * flag: A TRUE/FALSE value indicating if all machines within a given
       * domain can access the variable. Set TRUE when the cookie says
       * .domain.com and to false when the domain is complete www.domain.com
       */
      co->tailmatch = strcasecompare(ptr, "TRUE") ? TRUE : FALSE;
      break;
    case 2:
      /* The file format allows the path field to remain not filled in */
      if(strcmp("TRUE", ptr) && strcmp("FALSE", ptr)) {
        /* only if the path does not look like a boolean option! */
        co->path = strdup(ptr);
        if(!co->path)
          return CERR_OUT_OF_MEMORY;
        else {
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath)
            return CERR_OUT_OF_MEMORY;
        }
        break;
      }
      /* this does not look like a path, make one up! */
      co->path = strdup("/");
      if(!co->path)
        return CERR_OUT_OF_MEMORY;
      co->spath = strdup("/");
      if(!co->spath)
        return CERR_OUT_OF_MEMORY;
      fields++; /* add a field and fall down to secure */
      FALLTHROUGH();
    case 3:
      co->secure = FALSE;
      if(strcasecompare(ptr, "TRUE")) {
        if(secure || ci->running)
          co->secure = TRUE;
        else
          return CERR_BAD_SECURE;
      }
      break;
    case 4:
      if(curlx_strtoofft(ptr, NULL, 10, &co->expires))
        return CERR_RANGE;
      break;
    case 5:
      co->name = strdup(ptr);
      if(!co->name)
        return CERR_OUT_OF_MEMORY;
      else {
        /* For Netscape file format cookies we check prefix on the name */
        if(strncasecompare("__Secure-", co->name, 9))
          co->prefix_secure = TRUE;
        else if(strncasecompare("__Host-", co->name, 7))
          co->prefix_host = TRUE;
      }
      break;
    case 6:
      co->value = strdup(ptr);
      if(!co->value)
        return CERR_OUT_OF_MEMORY;
      break;
    }
  }
  if(6 == fields) {
    /* we got a cookie with blank contents, fix it */
    co->value = strdup("");
    if(!co->value)
      return CERR_OUT_OF_MEMORY;
    else
      fields++;
  }

  if(7 != fields)
    /* we did not find the sufficient number of fields */
    return CERR_FIELDS;

  return CERR_OK;
}